

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack29_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar12 = *(undefined1 (*) [32])(in + 1);
  uVar2 = *in;
  uVar1 = *(ulong *)(in + 10);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x401));
  auVar7 = vpmovsxbd_avx(ZEXT416(0x4010100));
  uVar3 = in[0xe];
  *out = uVar2 & 0x1fffffff;
  uVar4 = in[9];
  auVar11 = valignd_avx512vl(auVar12,auVar12,7);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar10 = vpsllvd_avx2(auVar14,auVar6);
  auVar8._8_8_ = 0x1ffffff01ffffffe;
  auVar8._0_8_ = 0x1ffffff01ffffffe;
  auVar9 = vpandq_avx512vl(auVar10,auVar8);
  auVar11 = vpblendd_avx2(auVar11,ZEXT432(uVar2),1);
  auVar10 = vpshufd_avx(*(undefined1 (*) [16])(in + 5),0xff);
  auVar12 = vpshldvd_avx512_vbmi2(auVar12,auVar11,_DAT_0018cd80);
  auVar13._8_4_ = 0x1fffffff;
  auVar13._0_8_ = 0x1fffffff1fffffff;
  auVar13._12_4_ = 0x1fffffff;
  auVar11._16_4_ = 0x1fffffff;
  auVar11._0_16_ = auVar13;
  auVar11._20_4_ = 0x1fffffff;
  auVar11._24_4_ = 0x1fffffff;
  auVar11._28_4_ = 0x1fffffff;
  auVar12 = vpand_avx2(auVar12,auVar11);
  *(undefined1 (*) [32])(out + 1) = auVar12;
  auVar10 = vpinsrd_avx(auVar10,uVar4,1);
  auVar10 = vpermi2d_avx512vl(auVar7,auVar10,auVar14);
  auVar8 = vpsrlvd_avx2(auVar10,_DAT_0019d140);
  auVar10 = vpinsrd_avx(auVar13,(uVar4 & 3) << 0x1b,0);
  uVar5 = *(ulong *)(in + 0xc);
  auVar10 = vpunpcklqdq_avx(auVar10,auVar9);
  auVar7 = vpor_avx(auVar8,auVar10);
  auVar10 = vpand_avx(auVar8,auVar13);
  auVar10 = vpblendd_avx2(auVar7,auVar10,2);
  *(undefined1 (*) [16])(out + 9) = auVar10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar5;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10 = vpermt2d_avx512vl(auVar10,auVar6,auVar9);
  auVar6 = vpsrlvd_avx2(auVar10,_DAT_0019d150);
  auVar10 = vpsllvd_avx2(auVar9,_DAT_0019cdc0);
  auVar7._8_8_ = 0x1ffffc001fffff80;
  auVar7._0_8_ = 0x1ffffc001fffff80;
  auVar10 = vpternlogq_avx512vl(auVar10,auVar6,auVar7,0xec);
  *(long *)(out + 0xd) = auVar10._0_8_;
  out[0xf] = (uVar3 & 0xffff) << 0xd | (uint)(uVar5 >> 0x33);
  return in + 0xf;
}

Assistant:

const uint32_t *__fastunpack29_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;

  return in + 1;
}